

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigDialog.cpp
# Opt level: O1

bool __thiscall ConfigDialog::apply(ConfigDialog *this)

{
  uint uVar1;
  Categories _t1;
  GeneralConfigTab *this_00;
  KeyboardConfigTab *this_01;
  SoundConfigTab *pSVar2;
  bool bVar3;
  GeneralConfig *config;
  PianoInput *input;
  SoundConfig *soundConfig;
  MidiConfig *midiConfig;
  bool bVar4;
  
  uVar1 = (this->mDirty).i;
  bVar4 = true;
  if (uVar1 != 0) {
    if ((uVar1 & 0x10) != 0) {
      this_00 = this->mGeneral;
      config = Config::general(this->mConfig);
      GeneralConfigTab::apply(this_00,config);
    }
    if (((this->mDirty).i & 2) != 0) {
      ConfigTab::clean(&this->mAppearance->super_ConfigTab);
    }
    if (((this->mDirty).i & 4) != 0) {
      this_01 = this->mKeyboard;
      input = Config::pianoInput(this->mConfig);
      KeyboardConfigTab::apply(this_01,input);
    }
    if (((this->mDirty).i & 1) != 0) {
      pSVar2 = this->mSound;
      soundConfig = Config::sound(this->mConfig);
      SoundConfigTab::apply(pSVar2,soundConfig);
    }
    if (((this->mDirty).i & 8) != 0) {
      pSVar2 = this->mSound;
      midiConfig = Config::midi(this->mConfig);
      SoundConfigTab::apply(pSVar2,midiConfig);
    }
    _t1.i = (this->mDirty).i;
    (this->mDirty).i = 0;
    applied(this,_t1);
    if ((this->mDirty).i == 0) {
      bVar3 = (bool)QDialogButtonBox::button((StandardButton)this->mButtons);
      QWidget::setEnabled(bVar3);
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

void ConfigDialog::clean() {
    mDirty = Config::CategoryNone;
    mButtons->button(QDialogButtonBox::Apply)->setEnabled(false);
}